

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall
DyndepParserTestBadBinding::DyndepParserTestBadBinding(DyndepParserTestBadBinding *this)

{
  DyndepParserTestBadBinding *this_local;
  
  DyndepParserTest::DyndepParserTest(&this->super_DyndepParserTest);
  (this->super_DyndepParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DyndepParserTestBadBinding_00262bb8;
  return;
}

Assistant:

TEST_F(DyndepParserTest, BadBinding) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
"  not_restat = 1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:3: binding is not 'restat'\n"
            "  not_restat = 1\n"
            "                ^ near here", err);
}